

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knucleotide.cc
# Opt level: O0

HashTable<1UL> * CalculateInThreads<3ul>(HashTable<1UL> *__return_storage_ptr__,Data *input)

{
  tuple<unsigned_long,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  *this;
  uint uVar1;
  bool bVar2;
  reference key;
  MappedReference<phmap::priv::FlatHashMapPolicy<Key<3UL>,_unsigned_int>_> puVar3;
  iterator iVar4;
  flat_hash_map<Key<3UL>,_unsigned_int,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
  *local_250;
  thread *local_238;
  HashTable<1UL> (**local_1c0) [4];
  flat_hash_map<Key<3UL>,_unsigned_int,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
  *local_190;
  pair<const_Key<3UL>,_unsigned_int> *j;
  iterator __end0;
  iterator __begin0;
  HashTable<1UL> *__range2;
  uint i_2;
  HashTable<1UL> *frequencies;
  thread *i_1;
  thread *__end1;
  thread *__begin1;
  thread (*__range1) [4];
  uint local_11c;
  undefined1 auStack_118 [4];
  uint i;
  type invoke;
  thread threads [4];
  undefined1 local_d8 [8];
  HashTable<1UL> hash_tables [4];
  Data *input_local;
  
  local_190 = (flat_hash_map<Key<3UL>,_unsigned_int,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
               *)local_d8;
  hash_tables[3].
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .settings_.
  super__Tuple_impl<0UL,_unsigned_long,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_long,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
        )(_Tuple_impl<0UL,_unsigned_long,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
          )input;
  do {
    phmap::
    flat_hash_map<Key<3UL>,_unsigned_int,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
    ::flat_hash_map(local_190);
    local_190 = local_190 + 0x30;
  } while (local_190 !=
           (flat_hash_map<Key<3UL>,_unsigned_int,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
            *)&hash_tables[3].
               super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
               .
               super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
               .settings_);
  local_1c0 = &invoke.hash_tables;
  do {
    std::thread::thread((thread *)local_1c0);
    local_1c0 = local_1c0 + 1;
  } while ((thread *)local_1c0 != threads + 3);
  _auStack_118 = (unsigned_long)
                 hash_tables[3].
                 super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
                 .
                 super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
                 .settings_.
                 super__Tuple_impl<0UL,_unsigned_long,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
                 .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  invoke.input = (Data *)local_d8;
  for (local_11c = 0; local_11c < 4; local_11c = local_11c + 1) {
    std::thread::
    thread<CalculateInThreads<3ul>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)::_lambda(unsigned_int)_1_&,unsigned_int&,void>
              ((thread *)&__range1,(type *)auStack_118,&local_11c);
    std::thread::operator=(threads + ((ulong)local_11c - 1),(thread *)&__range1);
    std::thread::~thread((thread *)&__range1);
  }
  for (__end1 = (thread *)&invoke.hash_tables; __end1 != threads + 3; __end1 = __end1 + 1) {
    std::thread::join();
  }
  for (__range2._4_4_ = 1; __range2._4_4_ < 4; __range2._4_4_ = __range2._4_4_ + 1) {
    this = &hash_tables[(ulong)__range2._4_4_ - 1].
            super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
            .
            super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
            .settings_;
    iVar4 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<3UL>,_unsigned_int>,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
            ::begin((raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<3UL>,_unsigned_int>,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
                     *)this);
    __end0.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)iVar4.ctrl_;
    iVar4 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<3UL>,_unsigned_int>,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
            ::end((raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<3UL>,_unsigned_int>,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
                   *)this);
    while( true ) {
      __end0.ctrl_ = (ctrl_t *)iVar4.field_1;
      j = (pair<const_Key<3UL>,_unsigned_int> *)iVar4.ctrl_;
      bVar2 = phmap::priv::operator!=((iterator *)&__end0.field_1,(iterator *)&j);
      if (!bVar2) break;
      key = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<3UL>,_unsigned_int>,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
            ::iterator::operator*((iterator *)&__end0.field_1);
      uVar1 = key->second;
      puVar3 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<3ul>,unsigned_int>,Key<3ul>::Hash,phmap::EqualTo<Key<3ul>>,std::allocator<std::pair<Key<3ul>const,unsigned_int>>>
               ::operator[]<Key<3ul>,phmap::priv::FlatHashMapPolicy<Key<3ul>,unsigned_int>>
                         ((raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<3ul>,unsigned_int>,Key<3ul>::Hash,phmap::EqualTo<Key<3ul>>,std::allocator<std::pair<Key<3ul>const,unsigned_int>>>
                           *)local_d8,(key_arg<Key<3UL>_> *)key);
      *puVar3 = uVar1 + *puVar3;
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<3UL>,_unsigned_int>,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
      ::iterator::operator++((iterator *)&__end0.field_1);
      iVar4.field_1.slot_ = (slot_type *)__end0.ctrl_;
      iVar4.ctrl_ = (ctrl_t *)j;
    }
  }
  phmap::
  flat_hash_map<Key<3UL>,_unsigned_int,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
  ::flat_hash_map((flat_hash_map<Key<3UL>,_unsigned_int,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
                   *)__return_storage_ptr__,
                  (flat_hash_map<Key<1UL>,_unsigned_int,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
                   *)local_d8);
  local_238 = threads + 3;
  do {
    local_238 = local_238 + -1;
    std::thread::~thread(local_238);
  } while (local_238 != (thread *)&invoke.hash_tables);
  local_250 = (flat_hash_map<Key<3UL>,_unsigned_int,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
               *)&hash_tables[3].
                  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
                  .
                  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
                  .settings_;
  do {
    local_250 = local_250 + -0x30;
    phmap::
    flat_hash_map<Key<3UL>,_unsigned_int,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
    ::~flat_hash_map(local_250);
  } while (local_250 !=
           (flat_hash_map<Key<3UL>,_unsigned_int,_Key<3UL>::Hash,_phmap::EqualTo<Key<3UL>_>,_std::allocator<std::pair<const_Key<3UL>,_unsigned_int>_>_>
            *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

HashTable<size> CalculateInThreads(const Cfg::Data& input)
{
    HashTable<size> hash_tables[thread_count];
    std::thread threads[thread_count];

    auto invoke = [&](unsigned begin) {
        Calculate<size>(input, begin, hash_tables[begin]);
    };

    for(unsigned i = 0; i < thread_count; ++i)
        threads[i] = std::thread(invoke, i);

    for(auto& i : threads)
        i.join();

    auto& frequencies = hash_tables[0];
    for(unsigned i = 1 ; i < thread_count; ++i)
        for(auto& j : hash_tables[i])
            frequencies[j.first] += j.second;

    // return the 'frequency' by move instead of copy.
    return std::move(frequencies);
}